

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O3

void __thiscall
irr::core::array<irr::core::string<unsigned_long>_>::reallocate
          (array<irr::core::string<unsigned_long>_> *this,u32 new_size)

{
  string<unsigned_long> *psVar1;
  void *pvVar2;
  uint uVar3;
  ulong *puVar4;
  undefined8 *puVar5;
  u32 uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  psVar1 = this->data;
  lVar8 = (ulong)new_size * 0x10;
  puVar4 = (ulong *)operator_new__(lVar8 + 8);
  *puVar4 = (ulong)new_size;
  if (new_size != 0) {
    lVar7 = 0;
    do {
      *(undefined8 *)((long)puVar4 + lVar7 + 8) = 0;
      *(undefined8 *)((long)puVar4 + lVar7 + 0x10) = 0x100000001;
      puVar5 = (undefined8 *)operator_new__(8);
      *(undefined8 **)((long)puVar4 + lVar7 + 8) = puVar5;
      *puVar5 = 0;
      lVar7 = lVar7 + 0x10;
    } while (lVar8 != lVar7);
  }
  this->data = (string<unsigned_long> *)(puVar4 + 1);
  this->allocated = new_size;
  uVar3 = this->used;
  uVar6 = new_size;
  if (uVar3 < new_size) {
    uVar6 = uVar3;
  }
  if (0 < (int)uVar6) {
    uVar9 = (ulong)uVar6;
    lVar8 = 0;
    do {
      string<unsigned_long>::operator=
                ((string<unsigned_long> *)((long)&this->data->array + lVar8),
                 (string<unsigned_long> *)((long)&psVar1->array + lVar8));
      lVar8 = lVar8 + 0x10;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
    new_size = this->allocated;
    uVar3 = this->used;
  }
  if (new_size < uVar3) {
    this->used = new_size;
  }
  if (psVar1 != (string<unsigned_long> *)0x0) {
    lVar8._0_4_ = psVar1[-1].allocated;
    lVar8._4_4_ = psVar1[-1].used;
    if (lVar8 != 0) {
      lVar8 = lVar8 << 4;
      do {
        pvVar2 = *(void **)((long)&psVar1[-1].array + lVar8);
        if (pvVar2 != (void *)0x0) {
          operator_delete__(pvVar2);
        }
        lVar8 = lVar8 + -0x10;
      } while (lVar8 != 0);
    }
    operator_delete__(&psVar1[-1].allocated);
    return;
  }
  return;
}

Assistant:

void reallocate(u32 new_size)
	{
		T* old_data = data;

		data = new T[new_size];
		allocated = new_size;
		
		s32 end = used < new_size ? used : new_size;
		for (s32 i=0; i<end; ++i)
			data[i] = old_data[i];

		if (allocated < used)
			used = allocated;
		
		delete [] old_data;
	}